

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall
Component_containsEncapsulatedComponent_Test::~Component_containsEncapsulatedComponent_Test
          (Component_containsEncapsulatedComponent_Test *this)

{
  Component_containsEncapsulatedComponent_Test *this_local;
  
  ~Component_containsEncapsulatedComponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, containsEncapsulatedComponent)
{
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    c->setName("child0");
    libcellml::ComponentPtr c1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr c2 = libcellml::Component::create("child2");
    libcellml::ComponentPtr c3 = libcellml::Component::create("child3");
    libcellml::ComponentPtr c4 = libcellml::Component::create("child4");
    libcellml::ComponentPtr c5 = libcellml::Component::create("child5");
    libcellml::ComponentPtr c6 = libcellml::Component::create("child6");

    c->addComponent(c1);
    c->addComponent(c2);
    c1->addComponent(c4);
    c1->addComponent(c5);
    c1->addComponent(c6);

    EXPECT_FALSE(m->containsComponent("child4", false));
    EXPECT_TRUE(m->containsComponent(c4, true));
}